

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImWchar_resizeT(ImVector_ImWchar *self,int new_size,ImWchar v)

{
  ImWchar local_16;
  int local_14;
  ImWchar v_local;
  ImVector_ImWchar *pIStack_10;
  int new_size_local;
  ImVector_ImWchar *self_local;
  
  local_16 = v;
  local_14 = new_size;
  pIStack_10 = self;
  ImVector<unsigned_short>::resize(self,new_size,&local_16);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImWchar_resizeT(ImVector_ImWchar* self,int new_size,const ImWchar v)
{
    return self->resize(new_size,v);
}